

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

void __thiscall QToolBarLayout::updateGeomArray(QToolBarLayout *this)

{
  Representation *pRVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Orientation OVar10;
  int iVar11;
  Orientation OVar12;
  QSizePolicy QVar13;
  int iVar14;
  int iVar15;
  QWidget *pQVar16;
  QStyle *pQVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  long lVar21;
  pointer pQVar22;
  ulong uVar23;
  byte bVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  QSize *pQVar29;
  QSize *pQVar30;
  int iVar31;
  long in_FS_OFFSET;
  bool bVar32;
  QMargins QVar33;
  QStyleOptionToolBar opt;
  int local_11c;
  QArrayDataPointer<QLayoutStruct> local_b8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    QLayout::parentWidget(&this->super_QLayout);
    pQVar16 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
    if (pQVar16 != (QWidget *)0x0) {
      pQVar17 = QWidget::style(pQVar16);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
      (**(code **)(*(long *)pQVar16 + 0x1a0))(pQVar16,(QStyleOptionToolBar *)local_98);
      bVar5 = movable(this);
      iVar7 = 0;
      if (bVar5) {
        iVar7 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x35,local_98,pQVar16);
      }
      QVar33 = QLayout::contentsMargins(&this->super_QLayout);
      iVar8 = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
      iVar9 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x39,local_98,pQVar16);
      OVar10 = QToolBar::orientation((QToolBar *)pQVar16);
      bVar5 = OVar10 != Vertical;
      (this->hint).wd = 0;
      (this->hint).ht = 0;
      (this->minSize).wd = 0;
      (this->minSize).ht = 0;
      iVar11 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x35,local_98,pQVar16);
      (&(this->minSize).wd)[bVar5].m_i = iVar11;
      iVar11 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x35,local_98,pQVar16);
      (&(this->hint).wd)[bVar5].m_i = iVar11;
      this->expanding = false;
      this->empty = false;
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_b8,(this->items).d.size + 1);
      if ((this->items).d.size == 0) {
        bVar5 = true;
      }
      else {
        lVar28 = 0;
        uVar23 = 0;
        local_11c = 0;
        do {
          plVar3 = *(long **)((long)(this->items).d.ptr + lVar28);
          uVar18 = (**(code **)(*plVar3 + 0x20))(plVar3);
          uVar19 = (**(code **)(*plVar3 + 0x18))(plVar3);
          uVar20 = (**(code **)(*plVar3 + 0x10))(plVar3);
          OVar12 = (**(code **)(*plVar3 + 0x28))(plVar3);
          bVar6 = (bool)(**(code **)(*plVar3 + 0x40))(plVar3);
          this->expanding = (bool)(this->expanding | (OVar12 & OVar10) != 0);
          lVar21 = (**(code **)(*plVar3 + 0x68))(plVar3);
          if (lVar21 != 0) {
            pQVar16 = (QWidget *)(**(code **)(*plVar3 + 0x68))(plVar3);
            QVar13 = QWidget::sizePolicy(pQVar16);
            if (((uint)QVar13.field_0 >> 0x11 & 1) != 0) {
              this->expandFlag = true;
            }
          }
          iVar11 = (int)((ulong)uVar20 >> 0x20);
          iVar27 = (int)((ulong)uVar19 >> 0x20);
          iVar31 = (int)uVar20;
          iVar14 = (int)uVar19;
          if (bVar6 == false) {
            iVar15 = iVar8;
            if (local_11c == 0) {
              iVar15 = iVar27;
              if (OVar10 == Horizontal) {
                iVar15 = iVar14;
              }
              pRVar1 = &(this->minSize).wd + (OVar10 != Horizontal);
              pRVar1->m_i = pRVar1->m_i + iVar15;
              iVar15 = 0;
            }
            iVar26 = iVar11;
            if (OVar10 == Vertical) {
              iVar26 = iVar31;
            }
            pQVar29 = (QSize *)&(this->hint).ht;
            iVar25 = iVar27;
            if (OVar10 == Vertical) {
              pQVar29 = &this->hint;
              iVar25 = iVar14;
            }
            pQVar30 = (QSize *)&(this->minSize).ht;
            if (OVar10 == Vertical) {
              pQVar30 = &this->minSize;
            }
            iVar2 = (pQVar30->wd).m_i;
            if (iVar25 < iVar2) {
              iVar25 = iVar2;
            }
            (&(this->minSize).wd)[bVar5].m_i = iVar25;
            iVar25 = iVar11;
            if (OVar10 == Horizontal) {
              iVar25 = iVar31;
            }
            pRVar1 = &(this->hint).wd + (OVar10 != Horizontal);
            pRVar1->m_i = pRVar1->m_i + iVar25 + iVar15;
            iVar15 = (pQVar29->wd).m_i;
            if (iVar26 < iVar15) {
              iVar26 = iVar15;
            }
            (&(this->hint).wd)[bVar5].m_i = iVar26;
            local_11c = local_11c + 1;
          }
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          bVar32 = OVar10 == Horizontal;
          if (bVar32) {
            iVar11 = iVar31;
          }
          (&pQVar22->sizeHint)[lVar28] = iVar11;
          uVar4 = uVar18 >> 0x20;
          if (bVar32) {
            uVar4 = uVar18;
          }
          if (bVar32) {
            iVar27 = iVar14;
          }
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar22->maximumSize)[lVar28] = (int)uVar4;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar22->minimumSize)[lVar28] = iVar27;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar22->expansive)[lVar28 * 4] = (OVar12 & OVar10) != 0;
          pQVar16 = (QWidget *)(**(code **)(*plVar3 + 0x68))(plVar3);
          QVar13 = QWidget::sizePolicy(pQVar16);
          bVar24 = QVar13.field_0._1_1_;
          if (OVar10 == Horizontal) {
            bVar24 = QVar13.field_0._0_1_;
          }
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar22->stretch)[lVar28] = (uint)bVar24;
          pQVar22 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
          (&pQVar22->empty)[lVar28 * 4] = bVar6;
          uVar23 = uVar23 + 1;
          lVar28 = lVar28 + 8;
        } while (uVar23 < (ulong)(this->items).d.size);
        bVar5 = local_11c == 0;
      }
      QArrayDataPointer<QLayoutStruct>::operator=(&(this->geomArray).d,&local_b8);
      this->empty = bVar5;
      bVar5 = OVar10 != Horizontal;
      pRVar1 = &(this->minSize).wd + bVar5;
      pRVar1->m_i = pRVar1->m_i + iVar7;
      iVar11 = QVar33.m_right.m_i.m_i + QVar33.m_left.m_i.m_i;
      (this->minSize).wd.m_i = (this->minSize).wd.m_i + iVar11;
      iVar27 = QVar33.m_bottom.m_i.m_i + QVar33.m_top.m_i.m_i;
      pRVar1 = &(this->minSize).ht;
      pRVar1->m_i = pRVar1->m_i + iVar27;
      if (1 < (ulong)(this->items).d.size) {
        pRVar1 = &(this->minSize).wd + bVar5;
        pRVar1->m_i = pRVar1->m_i + iVar9 + iVar8;
      }
      pRVar1 = &(this->hint).wd + bVar5;
      pRVar1->m_i = pRVar1->m_i + iVar7;
      (this->hint).wd.m_i = (this->hint).wd.m_i + iVar11;
      pRVar1 = &(this->hint).ht;
      pRVar1->m_i = pRVar1->m_i + iVar27;
      this->dirty = false;
      if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d)->super_QArrayData,0x20,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::updateGeomArray() const
{
    if (!dirty)
        return;

    QToolBarLayout *that = const_cast<QToolBarLayout*>(this);

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    that->minSize = QSize(0, 0);
    that->hint = QSize(0, 0);
    rperp(o, that->minSize) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);
    rperp(o, that->hint) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);

    that->expanding = false;
    that->empty = false;

    QList<QLayoutStruct> a(items.size() + 1); // + 1 for the stretch

    int count = 0;
    for (int i = 0; i < items.size(); ++i) {
        QToolBarItem *item = items.at(i);

        QSize max = item->maximumSize();
        QSize min = item->minimumSize();
        QSize hint = item->sizeHint();
        Qt::Orientations exp = item->expandingDirections();
        bool empty = item->isEmpty();

        that->expanding = expanding || exp & o;


        if (item->widget()) {
            if ((item->widget()->sizePolicy().horizontalPolicy() & QSizePolicy::ExpandFlag)) {
                that->expandFlag = true;
            }
        }

        if (!empty) {
            if (count == 0) // the minimum size only displays one widget
                rpick(o, that->minSize) += pick(o, min);
            int s = perp(o, minSize);
            rperp(o, that->minSize) = qMax(s, perp(o, min));

            //we only add spacing before item (ie never before the first one)
            rpick(o, that->hint) += (count == 0 ? 0 : spacing) + pick(o, hint);
            s = perp(o, that->hint);
            rperp(o, that->hint) = qMax(s, perp(o, hint));
            ++count;
        }

        a[i].sizeHint = pick(o, hint);
        a[i].maximumSize = pick(o, max);
        a[i].minimumSize = pick(o, min);
        a[i].expansive = exp & o;
        if (o == Qt::Horizontal)
            a[i].stretch = item->widget()->sizePolicy().horizontalStretch();
        else
            a[i].stretch = item->widget()->sizePolicy().verticalStretch();
        a[i].empty = empty;
    }

    that->geomArray = a;
    that->empty = count == 0;

    rpick(o, that->minSize) += handleExtent;
    that->minSize += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    if (items.size() > 1)
        rpick(o, that->minSize) += spacing + extensionExtent;

    rpick(o, that->hint) += handleExtent;
    that->hint += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    that->dirty = false;
}